

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satInterA.c
# Opt level: O1

void * Inta_ManInterpolate(Inta_Man_t *p,Sto_Man_t *pCnf,abctime TimeToStop,void *vVarsAB,
                          int fVerbose)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Sto_Man_t *p_00;
  int iVar4;
  FILE *pFVar5;
  long lVar6;
  int level;
  uint uVar7;
  Sto_Cls_t *pSVar8;
  long lVar9;
  Aig_Man_t *p_01;
  long lVar10;
  timespec ts;
  timespec local_50;
  double local_40;
  Aig_Man_t *local_38;
  
  iVar4 = clock_gettime(3,&local_50);
  if (iVar4 < 0) {
    lVar9 = -1;
  }
  else {
    lVar9 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
  }
  if (TimeToStop != 0) {
    iVar4 = clock_gettime(3,&local_50);
    if (iVar4 < 0) {
      lVar6 = -1;
    }
    else {
      lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    if (TimeToStop < lVar6) {
      return (void *)0x0;
    }
  }
  if ((pCnf->nVars < 1) || (pCnf->nClauses < 1)) {
    __assert_fail("pCnf->nVars > 0 && pCnf->nClauses > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satInterA.c"
                  ,0x3bc,
                  "void *Inta_ManInterpolate(Inta_Man_t *, Sto_Man_t *, abctime, void *, int)");
  }
  p->pCnf = pCnf;
  local_40 = (double)CONCAT44(local_40._4_4_,fVerbose);
  p->fVerbose = fVerbose;
  p->vVarsAB = (Vec_Int_t *)vVarsAB;
  local_38 = Aig_ManStart(10000);
  p->pAig = local_38;
  Aig_IthVar(local_38,p->vVarsAB->nSize + -1);
  Inta_ManResize(p);
  Inta_ManPrepareInter(p);
  if (p->fProofWrite != 0) {
    pFVar5 = fopen("proof.cnf_","w");
    p->pFile = (FILE *)pFVar5;
    p->Counter = 0;
  }
  pSVar8 = p->pCnf->pHead;
  if (pSVar8 != (Sto_Cls_t *)0x0) {
    do {
      if ((pSVar8->field_0x1c & 2) == 0) break;
      Inta_ManProofWriteOne(p,pSVar8);
      if (TimeToStop != 0) {
        iVar4 = clock_gettime(3,&local_50);
        if (iVar4 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
        }
        if (TimeToStop < lVar6) goto LAB_008d4e56;
      }
      pSVar8 = pSVar8->pNext;
    } while (pSVar8 != (Sto_Cls_t *)0x0);
  }
  iVar4 = Inta_ManProcessRoots(p);
  if ((iVar4 != 0) && (pSVar8 = p->pCnf->pHead, pSVar8 != (Sto_Cls_t *)0x0)) {
    do {
      if ((pSVar8->field_0x1c & 2) == 0) {
        iVar4 = Inta_ManProofRecordOne(p,pSVar8);
        if (iVar4 == 0) break;
        if (TimeToStop != 0) {
          iVar4 = clock_gettime(3,&local_50);
          if (iVar4 < 0) {
            lVar6 = -1;
          }
          else {
            lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
          }
          if (TimeToStop < lVar6) goto LAB_008d4e56;
        }
      }
      pSVar8 = pSVar8->pNext;
    } while (pSVar8 != (Sto_Cls_t *)0x0);
  }
  if (p->fProofWrite != 0) {
    fclose((FILE *)p->pFile);
    p->pFile = (FILE *)0x0;
  }
  if (local_40._0_4_ != 0) {
    p_00 = p->pCnf;
    uVar1 = p_00->nVars;
    uVar2 = p_00->nRoots;
    uVar3 = p->Counter;
    uVar7 = p_00->nClauses - uVar2;
    local_40 = (double)(int)(uVar3 - uVar2) / (double)(int)uVar7;
    iVar4 = Sto_ManMemoryReport(p_00);
    printf("Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB  ",
           local_40,(double)iVar4 * 9.5367431640625e-07,(ulong)uVar1,(ulong)uVar2,(ulong)uVar7,
           (ulong)uVar3);
    level = 3;
    iVar4 = clock_gettime(3,&local_50);
    lVar6 = -1;
    lVar10 = -1;
    if (-1 < iVar4) {
      lVar10 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    Abc_Print(level,"%s =","Time");
    Abc_Print(level,"%9.2f sec\n",(double)(lVar10 - lVar9) / 1000000.0);
    iVar4 = clock_gettime(3,&local_50);
    if (-1 < iVar4) {
      lVar6 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
    }
    p->timeTotal = p->timeTotal + (lVar6 - lVar9);
  }
  p_01 = local_38;
  Aig_ObjCreateCo(local_38,p->pInters[p->pCnf->pTail->Id]);
  Aig_ManCleanup(p_01);
LAB_008d4e63:
  p->pAig = (Aig_Man_t *)0x0;
  return p_01;
LAB_008d4e56:
  Aig_ManStop(local_38);
  p_01 = (Aig_Man_t *)0x0;
  goto LAB_008d4e63;
}

Assistant:

void * Inta_ManInterpolate( Inta_Man_t * p, Sto_Man_t * pCnf, abctime TimeToStop, void * vVarsAB, int fVerbose )
{
    Aig_Man_t * pRes;
    Aig_Obj_t * pObj;
    Sto_Cls_t * pClause;
    int RetValue = 1;
    abctime clkTotal = Abc_Clock();

    if ( TimeToStop && Abc_Clock() > TimeToStop )
        return NULL;

    // check that the CNF makes sense
    assert( pCnf->nVars > 0 && pCnf->nClauses > 0 );
    p->pCnf = pCnf;
    p->fVerbose = fVerbose;
    p->vVarsAB = (Vec_Int_t *)vVarsAB;
    p->pAig = pRes = Aig_ManStart( 10000 );
    Aig_IthVar( p->pAig, Vec_IntSize(p->vVarsAB) - 1 );

    // adjust the manager
    Inta_ManResize( p );

    // prepare the interpolant computation
    Inta_ManPrepareInter( p );

    // construct proof for each clause
    // start the proof
    if ( p->fProofWrite )
    {
        p->pFile = fopen( "proof.cnf_", "w" );
        p->Counter = 0;
    }

    // write the root clauses
    Sto_ManForEachClauseRoot( p->pCnf, pClause )
    {
        Inta_ManProofWriteOne( p, pClause );
        if ( TimeToStop && Abc_Clock() > TimeToStop )
        {
            Aig_ManStop( pRes );
            p->pAig = NULL;
            return NULL;
        }
    }

    // propagate root level assignments
    if ( Inta_ManProcessRoots( p ) )
    {
        // if there is no conflict, consider learned clauses
        Sto_ManForEachClause( p->pCnf, pClause )
        {
            if ( pClause->fRoot )
                continue;
            if ( !Inta_ManProofRecordOne( p, pClause ) )
            {
                RetValue = 0;
                break;
            }
            if ( TimeToStop && Abc_Clock() > TimeToStop )
            {
                Aig_ManStop( pRes );
                p->pAig = NULL;
                return NULL;
            }
        }
    }

    // stop the proof
    if ( p->fProofWrite )
    { 
        fclose( p->pFile );
//        Sat_ProofChecker( "proof.cnf_" );
        p->pFile = NULL;    
    }

    if ( fVerbose )
    {
//        ABC_PRT( "Interpo", Abc_Clock() - clkTotal );
    printf( "Vars = %d. Roots = %d. Learned = %d. Resol steps = %d.  Ave = %.2f.  Mem = %.2f MB  ", 
        p->pCnf->nVars, p->pCnf->nRoots, p->pCnf->nClauses-p->pCnf->nRoots, p->Counter,  
        1.0*(p->Counter-p->pCnf->nRoots)/(p->pCnf->nClauses-p->pCnf->nRoots), 
        1.0*Sto_ManMemoryReport(p->pCnf)/(1<<20) );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
p->timeTotal += Abc_Clock() - clkTotal;
    }

    pObj = *Inta_ManAigRead( p, p->pCnf->pTail );
    Aig_ObjCreateCo( pRes, pObj );
    Aig_ManCleanup( pRes );

    p->pAig = NULL;
    return pRes;
    
}